

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O0

void __thiscall level_tools::reconstruct_sound_envs(level_tools *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  xr_shape_object *pxVar3;
  bool bVar4;
  xr_level_snd_env *this_00;
  cf_face_vec *this_01;
  size_type sVar5;
  ulong uVar6;
  uint *__first;
  temp_box *this_02;
  reference pptVar7;
  const_reference pvVar8;
  const_reference this_03;
  reference pvVar9;
  xr_scene_objects *this_04;
  xr_custom_object_vec *this_05;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_06;
  reference pptVar10;
  xr_sound_env_object *pxVar11;
  char *pcVar12;
  string *psVar13;
  fvector3 *pfVar14;
  const_reference pvVar15;
  float _x;
  float _y;
  float _z;
  xr_sound_env_object *local_108;
  xr_sound_env_object *local_100;
  xr_sound_env_object *new_sound_env;
  temp_box *box;
  iterator end;
  iterator it;
  xr_name_gen name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *env_ids;
  xr_custom_object_vec *cobjects;
  cf_face *local_b8;
  uint_fast32_t next;
  long lStack_a8;
  uint32_t v;
  uint_fast32_t i;
  cf_face *local_98;
  cf_face *face;
  uint_fast32_t face_idx;
  size_type sStack_80;
  bool new_group;
  size_t k;
  uint *puStack_70;
  uint32_t group;
  uint32_t *groups;
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjacents;
  undefined1 local_40 [8];
  vector<temp_box_*,_std::allocator<temp_box_*>_> boxes;
  cf_vertex_vec *verts;
  cf_face_vec *faces;
  xr_level_snd_env *snd_env;
  level_tools *this_local;
  
  this_00 = xray_re::xr_level::snd_env(this->m_level);
  if (this_00 != (xr_level_snd_env *)0x0) {
    xray_re::msg("building %s","sound_env.part");
    this_01 = xray_re::xr_cform::faces(&this_00->super_xr_cform);
    boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)xray_re::xr_cform::vertices(&this_00->super_xr_cform);
    std::vector<temp_box_*,_std::allocator<temp_box_*>_>::vector
              ((vector<temp_box_*,_std::allocator<temp_box_*>_> *)local_40);
    sVar5 = std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::size(this_01);
    std::vector<temp_box_*,_std::allocator<temp_box_*>_>::reserve
              ((vector<temp_box_*,_std::allocator<temp_box_*>_> *)local_40,sVar5 / 0xc);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&groups);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&groups,0xc);
    sVar5 = std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::size(this_01);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar5;
    uVar6 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    __first = (uint *)operator_new__(uVar6);
    puStack_70 = __first;
    sVar5 = std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::size(this_01);
    std::uninitialized_fill_n<unsigned_int*,unsigned_long,unsigned_int>(__first,sVar5,&BAD_IDX);
    k._4_4_ = 0;
    sStack_80 = std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::size(this_01);
    while (sStack_80 != 0) {
      uVar6 = sStack_80 - 1;
      lVar2 = sStack_80 - 1;
      sStack_80 = uVar6;
      if (puStack_70[lVar2] == 0xffffffff) {
        face_idx._7_1_ = 1;
        face = (cf_face *)(uVar6 & 0xffffffff);
        while( true ) {
          local_98 = std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::operator[]
                               (this_01,(size_type)face);
          if ((face_idx._7_1_ & 1) == 0) {
            pptVar7 = std::vector<temp_box_*,_std::allocator<temp_box_*>_>::back
                                ((vector<temp_box_*,_std::allocator<temp_box_*>_> *)local_40);
            temp_box::collect(*pptVar7,local_98,
                              (cf_vertex_vec *)
                              boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            this_02 = (temp_box *)operator_new(0x4c);
            temp_box::temp_box(this_02,local_98,
                               (cf_vertex_vec *)
                               boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
            i = (uint_fast32_t)this_02;
            std::vector<temp_box_*,_std::allocator<temp_box_*>_>::push_back
                      ((vector<temp_box_*,_std::allocator<temp_box_*>_> *)local_40,(value_type *)&i)
            ;
            face_idx._7_1_ = 0;
          }
          puStack_70[(long)face] = k._4_4_;
          lStack_a8 = 3;
          while (lStack_a8 != 0) {
            next._4_4_ = *(uint *)((long)local_98 + lStack_a8 * 4 + -4);
            lStack_a8 = lStack_a8 + -1;
            pvVar8 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::
                     operator[]((vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_> *)
                                boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)next._4_4_)
            ;
            local_b8 = (cf_face *)(ulong)pvVar8->face0;
            while (local_b8 != (cf_face *)0xffffffff) {
              if ((local_b8 != face) && (puStack_70[(long)local_b8] == 0xffffffff)) {
                cobjects._4_4_ = local_b8._0_4_;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&groups,
                           (value_type_conflict2 *)((long)&cobjects + 4));
                puStack_70[(long)local_b8] = 0xffffffff;
              }
              this_03 = std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::operator[]
                                  (this_01,(size_type)local_b8);
              local_b8 = (cf_face *)xray_re::cf_face::next_face_idx(this_03,(ulong)next._4_4_);
            }
          }
          bVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&groups);
          if (bVar4) break;
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&groups);
          face = (cf_face *)(ulong)*pvVar9;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&groups);
        }
      }
    }
    if (puStack_70 != (uint *)0x0) {
      operator_delete__(puStack_70);
    }
    this_04 = &xray_re::xr_scene::sound_envs(this->m_scene)->super_xr_scene_objects;
    this_05 = xray_re::xr_scene_objects::objects(this_04);
    sVar5 = std::vector<temp_box_*,_std::allocator<temp_box_*>_>::size
                      ((vector<temp_box_*,_std::allocator<temp_box_*>_> *)local_40);
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_05,sVar5);
    this_06 = xray_re::xr_level_snd_env::env_ids_abi_cxx11_(this_00);
    xray_re::xr_name_gen::xr_name_gen((xr_name_gen *)&it,"sound_env",true);
    end = std::vector<temp_box_*,_std::allocator<temp_box_*>_>::begin
                    ((vector<temp_box_*,_std::allocator<temp_box_*>_> *)local_40);
    box = (temp_box *)
          std::vector<temp_box_*,_std::allocator<temp_box_*>_>::end
                    ((vector<temp_box_*,_std::allocator<temp_box_*>_> *)local_40);
    while (bVar4 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<temp_box_**,_std::vector<temp_box_*,_std::allocator<temp_box_*>_>_>
                                    *)&box), bVar4) {
      pptVar10 = __gnu_cxx::
                 __normal_iterator<temp_box_**,_std::vector<temp_box_*,_std::allocator<temp_box_*>_>_>
                 ::operator*(&end);
      new_sound_env = (xr_sound_env_object *)*pptVar10;
      pxVar11 = (xr_sound_env_object *)operator_new(200);
      xray_re::xr_sound_env_object::xr_sound_env_object(pxVar11,this->m_scene);
      local_100 = pxVar11;
      pcVar12 = xray_re::xr_name_gen::get((xr_name_gen *)&it);
      psVar13 = xray_re::xr_custom_object::co_name_abi_cxx11_((xr_custom_object *)local_100);
      std::__cxx11::string::operator=((string *)psVar13,pcVar12);
      pxVar11 = new_sound_env;
      pxVar3 = &new_sound_env->super_xr_shape_object;
      pfVar14 = xray_re::xr_custom_object::co_position((xr_custom_object *)local_100);
      (pfVar14->field_0).field_0.z =
           (pxVar11->super_xr_shape_object).super_xr_custom_object.m_position.field_0.field_0.y;
      *(undefined8 *)&pfVar14->field_0 =
           *(undefined8 *)((long)&(pxVar3->super_xr_custom_object).m_name.field_2 + 0xc);
      pfVar14 = xray_re::xr_custom_object::co_scale((xr_custom_object *)local_100);
      _x = xray_re::_vector3<float>::normalize_magn
                     ((_vector3<float> *)
                      ((long)&(new_sound_env->super_xr_shape_object).super_xr_custom_object.
                              _vptr_xr_custom_object + 4));
      _y = xray_re::_vector3<float>::normalize_magn
                     ((_vector3<float> *)
                      &(new_sound_env->super_xr_shape_object).super_xr_custom_object.m_flags);
      _z = xray_re::_vector3<float>::normalize_magn
                     ((_vector3<float> *)
                      ((long)&(new_sound_env->super_xr_shape_object).super_xr_custom_object.m_name.
                              _M_string_length + 4));
      xray_re::_vector3<float>::set(pfVar14,_x,_y,_z);
      pxVar3 = &new_sound_env->super_xr_shape_object;
      pfVar14 = xray_re::xr_custom_object::co_rotation((xr_custom_object *)local_100);
      xray_re::_matrix<float>::get_xyz
                ((_matrix<float> *)
                 ((long)&(pxVar3->super_xr_custom_object)._vptr_xr_custom_object + 4),pfVar14);
      pvVar15 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(this_06,(ulong)*(ushort *)
                                     &(new_sound_env->super_xr_shape_object).super_xr_custom_object.
                                      _vptr_xr_custom_object);
      psVar13 = xray_re::xr_sound_env_object::inner_abi_cxx11_(local_100);
      std::__cxx11::string::operator=((string *)psVar13,(string *)pvVar15);
      pvVar15 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(this_06,(ulong)*(ushort *)
                                     ((long)&(new_sound_env->super_xr_shape_object).
                                             super_xr_custom_object._vptr_xr_custom_object + 2));
      psVar13 = xray_re::xr_sound_env_object::outer_abi_cxx11_(local_100);
      std::__cxx11::string::operator=((string *)psVar13,(string *)pvVar15);
      if (new_sound_env != (xr_sound_env_object *)0x0) {
        operator_delete(new_sound_env,0x4c);
      }
      local_108 = local_100;
      std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
      push_back(this_05,(value_type *)&local_108);
      __gnu_cxx::
      __normal_iterator<temp_box_**,_std::vector<temp_box_*,_std::allocator<temp_box_*>_>_>::
      operator++(&end);
      xray_re::xr_name_gen::next((xr_name_gen *)&it);
    }
    xray_re::xr_level::clear_snd_env(this->m_level);
    xray_re::xr_name_gen::~xr_name_gen((xr_name_gen *)&it);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&groups);
    std::vector<temp_box_*,_std::allocator<temp_box_*>_>::~vector
              ((vector<temp_box_*,_std::allocator<temp_box_*>_> *)local_40);
  }
  return;
}

Assistant:

void level_tools::reconstruct_sound_envs()
{
	const xr_level_snd_env* snd_env = m_level->snd_env();
	if (snd_env == 0)
		return;
	msg("building %s", "sound_env.part");

	const cf_face_vec& faces = snd_env->faces();
	const cf_vertex_vec& verts = snd_env->vertices();

	std::vector<temp_box*> boxes;
	boxes.reserve(faces.size()/12);
	std::vector<uint32_t> adjacents;
	adjacents.reserve(12);

	uint32_t* groups = new uint32_t[faces.size()];
	xr_uninitialized_fill_n(groups, faces.size(), BAD_IDX);
	uint32_t group = 0;
	for (size_t k = faces.size(); k != 0;) {
		if (groups[--k] != BAD_IDX)
			continue;
		bool new_group = true;
		for (uint_fast32_t face_idx = uint_fast32_t(k & UINT32_MAX);;) {
			const cf_face& face = faces[face_idx];
			if (new_group) {
				boxes.push_back(new temp_box(face, verts));
				new_group = false;
			} else {
				boxes.back()->collect(face, verts);
			}
			groups[face_idx] = group;
			for (uint_fast32_t i = 3; i != 0;) {
				uint32_t v = face.v[--i];
				for (uint_fast32_t next = verts[v].face0; next != BAD_IDX;) {
					if (next != face_idx && groups[next] == BAD_IDX) {
						adjacents.push_back(uint32_t(next & UINT32_MAX));
						groups[next] = BAD_IDX;
					}
					next = faces[next].next_face_idx(v);
				}
			}
			if (adjacents.empty())
				break;
			face_idx = uint32_t(adjacents.back());
			adjacents.pop_back();
		}
	}
	delete[] groups;

	xr_custom_object_vec& cobjects = m_scene->sound_envs()->objects();
	cobjects.reserve(boxes.size());

	const std::vector<std::string>& env_ids = snd_env->env_ids();

	xr_name_gen name("sound_env");
	for (std::vector<temp_box*>::iterator it = boxes.begin(), end = boxes.end();
			it != end; ++it, name.next()) {
		temp_box* box = *it;
		xr_sound_env_object* new_sound_env = new xr_sound_env_object(*m_scene);
		new_sound_env->co_name() = name.get();
		new_sound_env->co_position() = box->xform.c;
		new_sound_env->co_scale().set(box->xform.i.normalize_magn(), box->xform.j.normalize_magn(),
			box->xform.k.normalize_magn());
		box->xform.get_xyz(new_sound_env->co_rotation());
		new_sound_env->inner() = env_ids.at(box->inner);
		new_sound_env->outer() = env_ids.at(box->outer);
		delete box;
		cobjects.push_back(new_sound_env);
	}
	m_level->clear_snd_env();
}